

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  int iVar1;
  
  if (dst != (EVP_PKEY_CTX *)this) {
    if (*(EVP_PKEY_CTX **)(dst + 0x10) == (EVP_PKEY_CTX *)0x0) {
      clear(this);
      return 0;
    }
    if (((*(long *)(dst + 8) == 0) || ((*(byte *)(*(long *)(dst + 8) + 0x20) & 4) != 0)) ||
       (dst[0x18] == (EVP_PKEY_CTX)0x0)) {
      iVar1 = copy(this,*(EVP_PKEY_CTX **)dst,*(EVP_PKEY_CTX **)(dst + 0x10));
      return iVar1;
    }
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attach
              (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,(StringRef *)dst)
    ;
  }
  return (int)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
}

Assistant:

size_t
	copy(const StringRef& src) {
		if (&src == this)
			return this->m_length;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		rc::BufHdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive) || !src.isNullTerminated())
			return copy(src.cp(), src.getLength());

		this->attach(src);
		return this->m_length;
	}